

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O3

ArgIface * __thiscall Args::CmdLine::findArgument(CmdLine *this,String *name)

{
  pointer ppCVar1;
  long lVar2;
  int iVar3;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var4;
  undefined4 extraout_var;
  ArgIface *pAVar5;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  long lVar6;
  Command *pCVar7;
  const_iterator __begin4;
  pointer ppCVar8;
  
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_pred<Args::CmdLine::findArgument(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>>
                    ((this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,name);
  if (_Var4._M_current ==
      (this->m_args).
      super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppCVar1 = (this->m_prevCommand).
              super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar8 = (this->m_prevCommand).
                   super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                   super__Vector_impl_data._M_start; pAVar5 = (ArgIface *)0x0, ppCVar8 != ppCVar1;
        ppCVar8 = ppCVar8 + 1) {
      pCVar7 = *ppCVar8;
      do {
        lVar2 = *(long *)(pCVar7 + 0x18);
        for (lVar6 = *(long *)(pCVar7 + 0x10); lVar6 != lVar2; lVar6 = lVar6 + 0x10) {
          pAVar5 = (ArgIface *)
                   (**(code **)(**(long **)(lVar6 + 8) + 0x70))(*(long **)(lVar6 + 8),name);
          if (pAVar5 != (ArgIface *)0x0) {
            return pAVar5;
          }
        }
        pCVar7 = *(Command **)(pCVar7 + 0xe8);
      } while (pCVar7 != (Command *)0x0);
    }
  }
  else {
    iVar3 = (*(((_Var4._M_current)->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[2])();
    pAVar5 = ((_Var4._M_current)->_M_t).
             super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
             super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
             super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    if (iVar3 != 0) {
      iVar3 = (*pAVar5->_vptr_ArgIface[0xe])(pAVar5,name);
      return (ArgIface *)CONCAT44(extraout_var,iVar3);
    }
  }
  return pAVar5;
}

Assistant:

const ArgIface * findArgument( const String & name ) const
	{
		auto it = std::find_if( m_args.cbegin(),
			m_args.cend(), [ &name ] ( const auto & arg ) -> bool
				{ return ( arg->findArgument( name ) != nullptr ); } );

		if( it != m_args.end() )
		{
			if( (*it)->type() == ArgType::Command )
				return it->get();
			else
				return (*it)->findArgument( name );
		}
		else if( !m_prevCommand.empty() )
		{
			for( const auto & c : m_prevCommand )
			{
				ArgIface * tmp = c->findChild( name );

				if( tmp )
					return tmp;
			}
		}

		return nullptr;
	}